

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bloaty.cc
# Opt level: O2

void __thiscall bloaty::DualMaps::PrintVMMaps(DualMaps *this)

{
  _Vector_base<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> _Stack_28;
  
  VmMaps((vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> *)&_Stack_28,
         this);
  PrintMaps(this,(vector<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_> *)
                 &_Stack_28);
  std::_Vector_base<const_bloaty::RangeMap_*,_std::allocator<const_bloaty::RangeMap_*>_>::
  ~_Vector_base(&_Stack_28);
  return;
}

Assistant:

void PrintVMMaps() { PrintMaps(VmMaps()); }